

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_connectionVariable2Missing_Test::TestBody(Parser_connectionVariable2Missing_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_1350;
  ParserPtr p;
  allocator<char> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  string local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component_bob\">\n    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n  </component>\n  <component name=\"component_dave\">\n    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n  </component>\n  <connection component_2=\"component_dave\" component_1=\"component_bob\">\n    <map_variables variable_1=\"variable_bob\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,
             "Connection in model \'\' does not specify a variable_2 in a map_variables element.",
             local_60);
  __l._M_len = 1;
  __l._M_array = (iterator)&p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,(allocator_type *)&gtest_trace_1350);
  std::__cxx11::string::~string((string *)&p);
  libcellml::Parser::create(SUB81(&p,0));
  libcellml::Parser::parseModel(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_1350,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x546,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Parser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_60,
             &p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_1350);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Parser, connectionVariable2Missing)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"component_dave\">\n"
        "    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_2=\"component_dave\" component_1=\"component_bob\">\n"
        "    <map_variables variable_1=\"variable_bob\"/>\n"
        "  </connection>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Connection in model '' does not specify a variable_2 in a map_variables element.",
    };

    // Parse
    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(e);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}